

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

int __thiscall Cmd::getColumns(Cmd *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t __n;
  uint uVar4;
  winsize ws;
  char seq [32];
  undefined1 local_50 [2];
  ushort local_4e;
  char local_48 [40];
  
  iVar1 = ioctl(1,0x5413,local_50);
  if (local_4e == 0 || iVar1 == -1) {
    iVar1 = getCursorPosition(this);
    uVar4 = 0x50;
    if ((((iVar1 != -1) && (sVar3 = write(this->out_fd_,"\x1b[999C",6), sVar3 == 6)) &&
        (uVar2 = getCursorPosition(this), uVar2 != 0xffffffff)) &&
       (uVar4 = uVar2, iVar1 < (int)uVar2)) {
      snprintf(local_48,0x20,"\x1b[%dD");
      __n = strlen(local_48);
      write(this->out_fd_,local_48,__n);
    }
  }
  else {
    uVar4 = (uint)local_4e;
  }
  return uVar4;
}

Assistant:

int getColumns() {
		struct winsize ws;

		if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
			// ioctl() failed. Try to query the terminal itself.
			int start, cols;

			// Get the initial position so we can restore it later.
			start = getCursorPosition();
			if (start == -1)
				return 80;

			// Go to right margin and get position.
			if (write_string("\x1b[999C") != 6)
				return 80;
			cols = getCursorPosition();
			if (cols == -1)
				return 80;

			// Restore position.
			if (cols > start) {
				char seq[32];
				snprintf(seq, sizeof(seq), "\x1b[%dD", cols - start);
				if (write_string(seq) == -1) {
					// Can't recover...
				}
			}
			return cols;
		} else {
			return ws.ws_col;
		}
	}